

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9150::setGyroFsr(RTIMUMPU9150 *this,uchar fsr)

{
  uchar fsr_local;
  RTIMUMPU9150 *this_local;
  
  switch(fsr) {
  case '\0':
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00013323124;
    this_local._7_1_ = true;
    break;
  default:
    fprintf(_stderr,"Illegal MPU9150 gyro fsr %d\n",(ulong)fsr);
    this_local._7_1_ = false;
    break;
  case '\b':
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00027925268;
    this_local._7_1_ = true;
    break;
  case '\x10':
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.00053211255;
    this_local._7_1_ = true;
    break;
  case '\x18':
    this->m_gyroFsr = fsr;
    this->m_gyroScale = 0.0010642251;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9150::setGyroFsr(unsigned char fsr)
{
    switch (fsr) {
    case MPU9150_GYROFSR_250:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (131.0 * 180.0);
        return true;

    case MPU9150_GYROFSR_500:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (62.5 * 180.0);
        return true;

    case MPU9150_GYROFSR_1000:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (32.8 * 180.0);
        return true;

    case MPU9150_GYROFSR_2000:
        m_gyroFsr = fsr;
        m_gyroScale = RTMATH_PI / (16.4 * 180.0);
        return true;

    default:
        HAL_ERROR1("Illegal MPU9150 gyro fsr %d\n", fsr);
        return false;
    }
}